

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_nmake.cpp
# Opt level: O2

void __thiscall
NmakeMakefileGenerator::writeResponseFileFiles
          (NmakeMakefileGenerator *this,QTextStream *t,ProStringList *files)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ProString *file;
  ProString *path;
  long in_FS_OFFSET;
  ProString escapedFilePath;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  path = (files->super_QList<ProString>).d.ptr;
  iVar3 = 0;
  for (lVar2 = (files->super_QList<ProString>).d.size * 0x30; lVar2 != 0; lVar2 = lVar2 + -0x30) {
    escapedFilePath.m_file = -0x55555556;
    escapedFilePath._36_4_ = 0xaaaaaaaa;
    escapedFilePath.m_hash = 0xaaaaaaaaaaaaaaaa;
    escapedFilePath.m_string.d.size = -0x5555555555555556;
    escapedFilePath.m_offset = -0x55555556;
    escapedFilePath.m_length = -0x55555556;
    escapedFilePath.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    escapedFilePath.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    MakefileGenerator::escapeFilePath(&escapedFilePath,(MakefileGenerator *)this,path);
    iVar4 = 0;
    if (iVar3 != 0) {
      if (escapedFilePath.m_length + iVar3 < 0x3e9) {
        QTextStream::operator<<(t,' ');
        iVar4 = iVar3 + 1;
      }
      else {
        QTextStream::operator<<(t,'\n');
        iVar4 = 0;
      }
    }
    operator<<(t,&escapedFilePath);
    iVar3 = iVar4 + escapedFilePath.m_length;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&escapedFilePath)
    ;
    path = path + 1;
  }
  QTextStream::operator<<(t,'\n');
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void NmakeMakefileGenerator::writeResponseFileFiles(QTextStream &t, const ProStringList &files)
{
    // Add line breaks in file lists in reponse files to work around LNK1170.
    // The actual line length limit is 131070, but let's use a smaller limit
    // in case other tools are similarly hampered.
    const int maxLineLength = 1000;
    int len = 0;
    for (const ProString &file : files) {
        const ProString escapedFilePath = escapeFilePath(file);
        if (len) {
            if (len + escapedFilePath.length() > maxLineLength) {
                t << '\n';
                len = 0;
            } else {
                t << ' ';
                len++;
            }
        }
        t << escapedFilePath;
        len += escapedFilePath.length();
    }
    t << '\n';
}